

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O0

unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
FastPForLib::vsencoding_codec(void)

{
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
  *in_stack_fffffffffffffff0;
  
  uVar1 = 0x10000;
  make_unique<vsencoding::VSEncodingBlocks,unsigned_int>((uint *)in_RDI._M_head_impl);
  std::unique_ptr<FastPForLib::IntegerCODEC,std::default_delete<FastPForLib::IntegerCODEC>>::
  unique_ptr<vsencoding::VSEncodingBlocks,std::default_delete<vsencoding::VSEncodingBlocks>,void>
            (in_stack_fffffffffffffff0,
             (unique_ptr<vsencoding::VSEncodingBlocks,_std::default_delete<vsencoding::VSEncodingBlocks>_>
              *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  std::unique_ptr<vsencoding::VSEncodingBlocks,_std::default_delete<vsencoding::VSEncodingBlocks>_>
  ::~unique_ptr((unique_ptr<vsencoding::VSEncodingBlocks,_std::default_delete<vsencoding::VSEncodingBlocks>_>
                 *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
          )(tuple<FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<IntegerCODEC> vsencoding_codec() {
  return make_unique<vsencoding::VSEncodingBlocks>(1U << 16);
}